

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O0

void __thiscall
FIX::SessionID::SessionID
          (SessionID *this,string *beginString,string *senderCompID,string *targetCompID,
          string *sessionQualifier)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_30;
  string *sessionQualifier_local;
  string *targetCompID_local;
  string *senderCompID_local;
  string *beginString_local;
  SessionID *this_local;
  
  local_30 = sessionQualifier;
  sessionQualifier_local = targetCompID;
  targetCompID_local = senderCompID;
  senderCompID_local = beginString;
  beginString_local = (string *)this;
  BeginString::BeginString(&this->m_beginString,beginString);
  SenderCompID::SenderCompID(&this->m_senderCompID,targetCompID_local);
  TargetCompID::TargetCompID(&this->m_targetCompID,sessionQualifier_local);
  std::__cxx11::string::string((string *)&this->m_sessionQualifier,(string *)local_30);
  this->m_isFIXT = false;
  std::__cxx11::string::string((string *)&this->m_frozenString);
  toString(this,&this->m_frozenString);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)senderCompID_local);
  bVar1 = std::operator==(&local_60,"FIXT");
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    this->m_isFIXT = true;
  }
  return;
}

Assistant:

SessionID( const std::string& beginString,
             const std::string& senderCompID,
             const std::string& targetCompID,
             const std::string& sessionQualifier = "" )
  : m_beginString( BeginString(beginString) ),
    m_senderCompID( SenderCompID(senderCompID) ),
    m_targetCompID( TargetCompID(targetCompID) ),
    m_sessionQualifier( sessionQualifier ),
    m_isFIXT(false)
  {
    toString(m_frozenString);
    if( beginString.substr(0, 4) == "FIXT" )
      m_isFIXT = true;
  }